

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O2

Cell * array_new<Lib::Set<Kernel::Literal*,Inferences::SharedTermHash>::Cell>
                 (void *placement,size_t length)

{
  Cell *pCVar1;
  Cell *res;
  bool bVar2;
  
  pCVar1 = (Cell *)placement;
  while (bVar2 = length != 0, length = length - 1, bVar2) {
    *(undefined4 *)placement = 0;
    placement = (void *)((long)placement + 0x10);
  }
  return pCVar1;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}